

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TreePushRawID(ImGuiID id)

{
  ImGuiWindow *this;
  float unaff_retaddr;
  ImGuiWindow *window;
  uint *in_stack_ffffffffffffffe8;
  
  this = GetCurrentWindow();
  Indent(unaff_retaddr);
  (this->DC).TreeDepth = (this->DC).TreeDepth + 1;
  ImVector<unsigned_int>::push_back((ImVector<unsigned_int> *)this,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void ImGui::TreePushRawID(ImGuiID id)
{
    ImGuiWindow* window = GetCurrentWindow();
    Indent();
    window->DC.TreeDepth++;
    window->IDStack.push_back(id);
}